

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegendreBlock.test.cpp
# Opt level: O2

string * chunk_abi_cxx11_(void)

{
  string *in_RDI;
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)in_RDI,
             " 0.000000+0 0.000000+0          1          2          3          3943734  2     \n 0.000000+0 0.000000+0          0          5          7          3943734  2     \n 0.000000+0 1.000000+2 2.000000+2 1.000000+0 2.000000+0 3.000000+0943734  2     \n 4.000000+0                                                       943734  2     \n 0.000000+0 0.000000+0          0          6         13          3943734  2     \n 1.100000+0 1.200000+0 1.300000+0 2.100000+0 2.200000+0 2.300000+0943734  2     \n 2.400000+0 1.000000+0 2.000000+0 3.000000+0 4.000000+0 5.000000+0943734  2     \n 6.000000+0                                                       943734  2     \n 0.000000+0 0.000000+0          0          1          4          2943734  2     \n 1.000000+0 2.000000+0 3.000000+0 4.000000+0                      943734  2     \n"
             ,&local_9);
  return in_RDI;
}

Assistant:

std::string chunk() {
  return
    " 0.000000+0 0.000000+0          1          2          3          3943734  2     \n"
    " 0.000000+0 0.000000+0          0          5          7          3943734  2     \n"
    " 0.000000+0 1.000000+2 2.000000+2 1.000000+0 2.000000+0 3.000000+0943734  2     \n"
    " 4.000000+0                                                       943734  2     \n"
    " 0.000000+0 0.000000+0          0          6         13          3943734  2     \n"
    " 1.100000+0 1.200000+0 1.300000+0 2.100000+0 2.200000+0 2.300000+0943734  2     \n"
    " 2.400000+0 1.000000+0 2.000000+0 3.000000+0 4.000000+0 5.000000+0943734  2     \n"
    " 6.000000+0                                                       943734  2     \n"
    " 0.000000+0 0.000000+0          0          1          4          2943734  2     \n"
    " 1.000000+0 2.000000+0 3.000000+0 4.000000+0                      943734  2     \n";
}